

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

void aiMultiplyMatrix4(aiMatrix4x4 *dst,aiMatrix4x4 *src)

{
  aiMatrix4x4t<float> temp;
  aiMatrix4x4t<float> local_58;
  
  if (dst == (aiMatrix4x4 *)0x0) {
    __assert_fail("__null != dst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Assimp.cpp"
                  ,0x283,"void aiMultiplyMatrix4(aiMatrix4x4 *, const aiMatrix4x4 *)");
  }
  if (src != (aiMatrix4x4 *)0x0) {
    local_58.a1 = dst->a1;
    local_58.a2 = dst->a2;
    local_58.a3 = dst->a3;
    local_58.a4 = dst->a4;
    local_58.b1 = dst->b1;
    local_58.b2 = dst->b2;
    local_58.b3 = dst->b3;
    local_58.b4 = dst->b4;
    local_58.c1 = dst->c1;
    local_58.c2 = dst->c2;
    local_58.c3 = dst->c3;
    local_58.c4 = dst->c4;
    local_58.d1 = dst->d1;
    local_58.d2 = dst->d2;
    local_58.d3 = dst->d3;
    local_58.d4 = dst->d4;
    aiMatrix4x4t<float>::operator*=(&local_58,src);
    dst->a1 = local_58.a1;
    dst->a2 = local_58.a2;
    dst->a3 = local_58.a3;
    dst->a4 = local_58.a4;
    dst->b1 = local_58.b1;
    dst->b2 = local_58.b2;
    dst->b3 = local_58.b3;
    dst->b4 = local_58.b4;
    dst->c1 = local_58.c1;
    dst->c2 = local_58.c2;
    dst->c3 = local_58.c3;
    dst->c4 = local_58.c4;
    dst->d1 = local_58.d1;
    dst->d2 = local_58.d2;
    dst->d3 = local_58.d3;
    dst->d4 = local_58.d4;
    return;
  }
  __assert_fail("__null != src",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Assimp.cpp"
                ,0x284,"void aiMultiplyMatrix4(aiMatrix4x4 *, const aiMatrix4x4 *)");
}

Assistant:

ASSIMP_API void aiMultiplyMatrix4(
    aiMatrix4x4* dst,
    const aiMatrix4x4* src)
{
    ai_assert( NULL != dst );
    ai_assert( NULL != src );
    *dst = (*dst) * (*src);
}